

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O1

const_iterator * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>::
cbegin(const_iterator *__return_storage_ptr__,
      heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
      *this)

{
  void *pvVar1;
  ControlBlock *i_control;
  
  for (i_control = this->m_head; this->m_tail != i_control;
      i_control = (ControlBlock *)(i_control->m_next & 0xfffffffffffffff8)) {
    if ((i_control->m_next & 3) == 0) goto LAB_00e29f3b;
  }
  i_control = (QueueControl *)0x0;
LAB_00e29f3b:
  __return_storage_ptr__->m_control = i_control;
  __return_storage_ptr__->m_queue = this;
  if (i_control != (QueueControl *)0x0) {
    pvVar1 = get_element(i_control);
    (__return_storage_ptr__->m_value).m_pair.m_address = pvVar1;
    (__return_storage_ptr__->m_value).m_pair.m_type.m_feature_table =
         (tuple_type *)i_control[1].m_next;
  }
  return __return_storage_ptr__;
}

Assistant:

const_iterator cbegin() const noexcept { return const_iterator(this, first_valid(m_head)); }